

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-vec.c
# Opt level: O3

void tcg_gen_st_vec_mipsel(TCGContext_conflict4 *tcg_ctx,TCGv_vec r,TCGv_ptr b,TCGArg o)

{
  uint uVar1;
  TCGOp *pTVar2;
  uintptr_t o_2;
  
  uVar1 = *(uint *)(r + (long)&tcg_ctx->pool_cur);
  pTVar2 = tcg_emit_op_mipsel(tcg_ctx,INDEX_op_st_vec);
  pTVar2->field_0x1 = (byte)((uVar1 >> 8) + 0xe00 >> 8) & 0xf;
  pTVar2->args[0] = (TCGArg)(r + (long)&tcg_ctx->pool_cur);
  pTVar2->args[1] = (TCGArg)(b + (long)tcg_ctx);
  pTVar2->args[2] = o;
  return;
}

Assistant:

void tcg_gen_st_vec(TCGContext *tcg_ctx, TCGv_vec r, TCGv_ptr b, TCGArg o)
{
    vec_gen_ldst(tcg_ctx, INDEX_op_st_vec, r, b, o);
}